

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_clear.c
# Opt level: O0

int cmd_clear_opt(yl_opt *yo,char *cmdline,char ***posv,int *posc)

{
  undefined1 local_e8 [8];
  option options [5];
  undefined1 local_40 [4];
  int local_3c;
  int opt_index;
  int opt;
  int argc;
  int rc;
  int *posc_local;
  char ***posv_local;
  char *cmdline_local;
  yl_opt *yo_local;
  
  opt = 0;
  opt_index = 0;
  _argc = posc;
  posc_local = (int *)posv;
  posv_local = (char ***)cmdline;
  cmdline_local = (char *)yo;
  memcpy(local_e8,&PTR_anon_var_dwarf_135_0011b400,0xa0);
  cmdline_local[0x10] = '\x04';
  cmdline_local[0x11] = '\0';
  opt = parse_cmdline((char *)posv_local,&opt_index,(char ***)(cmdline_local + 0xf8));
  if (opt != 0) {
    return opt;
  }
  do {
    local_3c = getopt_long(opt_index,*(undefined8 *)(cmdline_local + 0xf8),commands[9].optstring,
                           local_e8,local_40);
    if (local_3c == -1) {
      *(long *)posc_local = *(long *)(cmdline_local + 0xf8) + (long)_optind * 8;
      *_argc = opt_index - _optind;
      return opt;
    }
    switch(local_3c) {
    case 0x59:
      *(ushort *)(cmdline_local + 0x10) = *(ushort *)(cmdline_local + 0x10) & 0xfffb;
      *(undefined8 *)(cmdline_local + 8) = _optarg;
      if (*(long *)(cmdline_local + 8) == 0) {
        yl_log('\x01',"Memory allocation error.");
        return 1;
      }
      break;
    default:
      yl_log('\x01',"Unknown option.");
      return 1;
    case 0x68:
      cmd_clear_help();
      return 1;
    case 0x69:
      if ((*(ushort *)(cmdline_local + 0x10) & 2) == 0) {
        *(ushort *)(cmdline_local + 0x10) = *(ushort *)(cmdline_local + 0x10) | 2;
      }
      else {
        *(ushort *)(cmdline_local + 0x10) = *(ushort *)(cmdline_local + 0x10) & 0xfffd;
        *(ushort *)(cmdline_local + 0x10) = *(ushort *)(cmdline_local + 0x10) | 1;
      }
      break;
    case 0x79:
      *(ushort *)(cmdline_local + 0x10) = *(ushort *)(cmdline_local + 0x10) & 0xfffb;
    }
  } while( true );
}

Assistant:

int
cmd_clear_opt(struct yl_opt *yo, const char *cmdline, char ***posv, int *posc)
{
    int rc = 0, argc = 0;
    int opt, opt_index;
    struct option options[] = {
        {"make-implemented",    no_argument, NULL, 'i'},
        {"yang-library",        no_argument, NULL, 'y'},
        {"yang-library-file",   no_argument, NULL, 'Y'},
        {"help",             no_argument, NULL, 'h'},
        {NULL, 0, NULL, 0}
    };

    yo->ctx_options = LY_CTX_NO_YANGLIBRARY;

    if ((rc = parse_cmdline(cmdline, &argc, &yo->argv))) {
        return rc;
    }

    while ((opt = getopt_long(argc, yo->argv, commands[CMD_CLEAR].optstring, options, &opt_index)) != -1) {
        switch (opt) {
        case 'i':
            if (yo->ctx_options & LY_CTX_REF_IMPLEMENTED) {
                yo->ctx_options &= ~LY_CTX_REF_IMPLEMENTED;
                yo->ctx_options |= LY_CTX_ALL_IMPLEMENTED;
            } else {
                yo->ctx_options |= LY_CTX_REF_IMPLEMENTED;
            }
            break;
        case 'y':
            yo->ctx_options &= ~LY_CTX_NO_YANGLIBRARY;
            break;
        case 'Y':
            yo->ctx_options &= ~LY_CTX_NO_YANGLIBRARY;
            yo->yang_lib_file = optarg;
            if (!yo->yang_lib_file) {
                YLMSG_E("Memory allocation error.");
                return 1;
            }
            break;
        case 'h':
            cmd_clear_help();
            return 1;
        default:
            YLMSG_E("Unknown option.");
            return 1;
        }
    }

    *posv = &yo->argv[optind];
    *posc = argc - optind;

    return rc;
}